

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm2d_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_efad74::AV1LbdInvTxfm2d_DISABLED_Speed_Test::TestBody
          (AV1LbdInvTxfm2d_DISABLED_Speed_Test *this)

{
  bool bVar1;
  int i;
  int j;
  int in_stack_0000919c;
  int in_stack_000091a0;
  TxSize in_stack_000091a6;
  TxType in_stack_000091a7;
  AV1LbdInvTxfm2d *in_stack_000091a8;
  undefined4 local_10;
  undefined4 local_c;
  
  for (local_c = 1; local_c < 0x13; local_c = local_c + 1) {
    for (local_10 = 0; local_10 < 0x10; local_10 = local_10 + 1) {
      bVar1 = libaom_test::IsTxSizeTypeValid((TX_SIZE)local_c,(TX_TYPE)local_10);
      if (bVar1) {
        AV1LbdInvTxfm2d::RunAV1InvTxfm2dTest
                  (in_stack_000091a8,in_stack_000091a7,in_stack_000091a6,in_stack_000091a0,
                   in_stack_0000919c);
      }
    }
  }
  return;
}

Assistant:

TEST_P(AV1LbdInvTxfm2d, DISABLED_Speed) {
  for (int j = 1; j < (int)(TX_SIZES_ALL); ++j) {
    for (int i = 0; i < (int)TX_TYPES; ++i) {
      if (libaom_test::IsTxSizeTypeValid(static_cast<TxSize>(j),
                                         static_cast<TxType>(i))) {
        RunAV1InvTxfm2dTest(static_cast<TxType>(i), static_cast<TxSize>(j),
                            10000000);
      }
    }
  }
}